

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

bool __thiscall kj::UnixEventPort::processEpollEvents(UnixEventPort *this,epoll_event *events,int n)

{
  anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 __fd;
  int iVar1;
  ssize_t sVar2;
  undefined4 extraout_var;
  TimePoint newTime;
  byte bVar4;
  ulong uVar5;
  Fault f;
  Fault f_1;
  uint64_t value;
  Fault local_80;
  Fault local_78;
  undefined8 uStack_70;
  undefined8 local_60;
  Fault local_58;
  undefined8 uStack_50;
  epoll_event *local_40;
  ulong local_38;
  ssize_t sVar3;
  undefined4 extraout_var_00;
  
  if (n < 1) {
    bVar4 = 0;
  }
  else {
    local_38 = (ulong)(uint)n;
    uVar5 = 0;
    local_60 = 0;
    local_40 = events;
    do {
      if (events[uVar5].data.ptr == (void *)0x1) {
        if ((this->timerFd).ptr.isSet == false) {
          local_58.exception = (Exception *)0x0;
          local_78.exception = (Exception *)0x0;
          uStack_70 = 0;
          kj::_::Debug::Fault::init
                    (&local_58,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_58);
        }
        __fd = (this->timerFd).ptr.field_1;
        local_58.exception = (Exception *)0x0;
        uStack_50 = 0;
        do {
          sVar2 = read((int)__fd,&local_58,0x10);
          if (-1 < sVar2) {
            iVar1 = 0;
            break;
          }
          iVar1 = kj::_::Debug::getOsErrorNumber(true);
        } while (iVar1 == -1);
        if (iVar1 != 0) {
          local_80.exception = (Exception *)0x0;
          local_78.exception = (Exception *)0x0;
          uStack_70 = 0;
          kj::_::Debug::Fault::init
                    (&local_80,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_80);
        }
        local_80.exception._0_1_ = sVar2 == 8 || sVar2 < 0;
        if (sVar2 != 8 && sVar2 >= 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                    (&local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                     ,0x291,FAILED,"n == 8 || n < 0","_kjCondition,",(bool *)&local_80);
          kj::_::Debug::Fault::fatal(&local_78);
        }
        this->timerfdIsArmed = false;
        events = local_40;
      }
      else if (events[uVar5].data.ptr == (void *)0x0) {
        do {
          sVar2 = read((this->eventFd).fd,&local_58,8);
          if (-1 < sVar2) {
            iVar1 = 0;
            sVar3 = sVar2;
            break;
          }
          iVar1 = kj::_::Debug::getOsErrorNumber(true);
          sVar3 = CONCAT44(extraout_var,iVar1);
        } while (iVar1 == -1);
        if (iVar1 != 0) {
          local_80.exception = (Exception *)0x0;
          local_78.exception = (Exception *)0x0;
          uStack_70 = 0;
          kj::_::Debug::Fault::init
                    (&local_80,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_80);
        }
        local_80.exception._0_1_ = sVar2 == 8 || sVar2 < 0;
        if (sVar2 != 8 && sVar2 >= 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                    (&local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                     ,0x287,FAILED,"n < 0 || n == sizeof(value)","_kjCondition,",(bool *)&local_80);
          kj::_::Debug::Fault::fatal(&local_78);
        }
        local_60 = CONCAT71((int7)((ulong)sVar3 >> 8),1);
      }
      else {
        FdObserver::fire((FdObserver *)events[uVar5].data.ptr,(short)events[uVar5].events);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_38);
    bVar4 = (byte)local_60;
  }
  newTime.value.value._0_4_ = (**this->clock->_vptr_MonotonicClock)();
  newTime.value.value._4_4_ = extraout_var_00;
  TimerImpl::advanceTo(&this->timerImpl,newTime);
  return (bool)(bVar4 & 1);
}

Assistant:

bool UnixEventPort::processEpollEvents(struct epoll_event events[], int n) {
  bool woken = false;

  for (int i = 0; i < n; i++) {
    if (events[i].data.u64 == 0) {
      // Someone called wake() from another thread. Consume the event.
      uint64_t value;
      ssize_t n;
      KJ_NONBLOCKING_SYSCALL(n = read(eventFd, &value, sizeof(value)));
      KJ_ASSERT(n < 0 || n == sizeof(value));

      // We were woken. Need to return true.
      woken = true;
    } else if (events[i].data.u64 == 1) {
      // timerfd fired. We need to clear it by reading it.
      int tfd = KJ_ASSERT_NONNULL(timerFd).get();
      char buffer[16]{};
      ssize_t n;
      KJ_NONBLOCKING_SYSCALL(n = read(tfd, buffer, sizeof(buffer)));
      KJ_ASSERT(n == 8 || n < 0);

      timerfdIsArmed = false;

      // The purpose of this event is just to wake up the event loop when needed. We'll check the
      // timer queue separately, so we don't need to do anything special in response to this event
      // here.
    } else {
      FdObserver* observer = reinterpret_cast<FdObserver*>(events[i].data.ptr);
      observer->fire(events[i].events);
    }
  }

  timerImpl.advanceTo(clock.now());

  return woken;
}